

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepFaceIntegrationPoints.h
# Opt level: O2

IntegrationPointList<2> *
anurbs::BrepFaceIntegrationPoints::get
          (IntegrationPointList<2> *__return_storage_ptr__,BrepFace *face,double tolerance)

{
  undefined8 *puVar1;
  double dVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  double dVar4;
  element_type *peVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  element_type *peVar8;
  pointer ptVar9;
  pointer ptVar10;
  long lVar11;
  long lVar12;
  pointer ptVar13;
  long lVar14;
  __shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2> *p_Var15;
  Polygon *pPVar16;
  double dVar17;
  double dVar18;
  IntegrationPointList<2> points_1;
  IntegrationPointList<2> points;
  Ref<anurbs::BrepLoop> loop;
  pointer local_138;
  vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>
  *local_130;
  BrepFace *local_128;
  Polygon *local_120;
  Ref<anurbs::BrepTrim> trim;
  undefined1 local_f0 [56];
  TrimmedSurfaceClipping clipper;
  
  TrimmedSurfaceClipping::TrimmedSurfaceClipping(&clipper,tolerance * 10.0,tolerance / 10.0);
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_130 = (vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>
               *)__return_storage_ptr__;
  local_128 = face;
  std::vector<anurbs::Ref<anurbs::BrepLoop>,_std::allocator<anurbs::Ref<anurbs::BrepLoop>_>_>::
  vector((vector<anurbs::Ref<anurbs::BrepLoop>,_std::allocator<anurbs::Ref<anurbs::BrepLoop>_>_> *)
         &points,&face->m_loops);
  local_120 = (Polygon *)
              points.
              super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar16 = (Polygon *)
                 points.
                 super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pPVar16 != local_120;
      pPVar16 = (Polygon *)
                &(pPVar16->outer_path).
                 super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::__shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2> *)&loop,
               (__shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2> *)pPVar16)
    ;
    TrimmedSurfaceClipping::begin_loop(&clipper);
    std::__shared_ptr<anurbs::BrepLoop,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<anurbs::BrepLoop,_(__gnu_cxx::_Lock_policy)2> *)&trim,
               &((loop.m_entry.
                  super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->m_data).super___shared_ptr<anurbs::BrepLoop,_(__gnu_cxx::_Lock_policy)2>);
    std::vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>::
    vector((vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_> *
           )&points_1,
           (vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_> *
           )&((trim.m_entry.
               super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->m_key)._M_string_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&trim.m_entry.
                super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ptVar9 = points_1.
             super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (p_Var15 = (__shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2> *)
                   points_1.
                   super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        p_Var15 !=
        (__shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2> *)ptVar9;
        p_Var15 = p_Var15 + 1) {
      std::__shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2> *)&trim,
                 p_Var15);
      std::__shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 0x28),
                 &((trim.m_entry.
                    super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_data).super___shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>
                );
      BrepTrim::curve_2d((BrepTrim *)local_f0);
      TrimmedSurfaceClipping::add_curve(&clipper,(CurveBase<2L> *)local_f0._0_8_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 0x30));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&trim.m_entry.
                  super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>::
    ~vector((vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
             *)&points_1);
    TrimmedSurfaceClipping::end_loop(&clipper);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&loop.m_entry.
                super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::vector<anurbs::Ref<anurbs::BrepLoop>,_std::allocator<anurbs::Ref<anurbs::BrepLoop>_>_>::
  ~vector((vector<anurbs::Ref<anurbs::BrepLoop>,_std::allocator<anurbs::Ref<anurbs::BrepLoop>_>_> *)
          &points);
  std::__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
                *)&points_1,
               (__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
                *)&local_128->m_geometry);
  std::__shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2> *)&points,
             (__shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2> *)
             &points_1.
              super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super__Tuple_impl<0UL,_double,_double,_double>.super__Head_base<0UL,_double,_false>);
  ptVar9 = points.
           super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &points.
              super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &points_1.
              super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  (**(code **)((long)(ptVar9->super__Tuple_impl<0UL,_double,_double,_double>).
                     super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
                     super__Head_base<2UL,_double,_false>._M_head_impl + 0x40))(&points,ptVar9);
  (**(code **)((long)(ptVar9->super__Tuple_impl<0UL,_double,_double,_double>).
                     super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
                     super__Head_base<2UL,_double,_false>._M_head_impl + 0x48))(&points_1,ptVar9);
  TrimmedSurfaceClipping::compute
            (&clipper,(vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *)&points,
             (vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *)&points_1);
  std::_Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>::~_Vector_base
            ((_Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_> *)&points_1);
  std::_Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>::~_Vector_base
            ((_Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_> *)&points);
  lVar11 = (**(code **)((long)(ptVar9->super__Tuple_impl<0UL,_double,_double,_double>).
                              super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
                              super__Head_base<2UL,_double,_false>._M_head_impl + 0x10))(ptVar9);
  lVar12 = (**(code **)((long)(ptVar9->super__Tuple_impl<0UL,_double,_double,_double>).
                              super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
                              super__Head_base<2UL,_double,_false>._M_head_impl + 0x18))();
  lVar14 = lVar12;
  if (lVar12 < lVar11) {
    lVar14 = lVar11;
  }
  local_128 = (BrepFace *)(lVar14 + 1);
  local_f0._24_8_ = lVar11 + 1;
  local_f0._16_8_ = lVar12 + 1;
  for (lVar14 = 0;
      lVar14 < (long)clipper.m_spans_u.
                     super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)clipper.m_spans_u.
                     super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl
                     .super__Vector_impl_data._M_start >> 4; lVar14 = lVar14 + 1) {
    local_f0._32_8_ = lVar14 << 4;
    for (lVar11 = 0;
        lVar12 = (long)clipper.m_spans_v.
                       super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)clipper.m_spans_v.
                       super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 4, lVar11 < lVar12;
        lVar11 = lVar11 + 1) {
      lVar12 = lVar12 * lVar14;
      if (clipper.m_span_trim_type.
          super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>._M_impl.
          super__Vector_impl_data._M_start[lVar12 + lVar11] != Empty) {
        if (clipper.m_span_trim_type.
            super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>._M_impl.
            super__Vector_impl_data._M_start[lVar12 + lVar11] == Full) {
          puVar1 = (undefined8 *)
                   ((long)&((EntryBase *)local_f0._32_8_)->_vptr_EntryBase +
                   (long)&(clipper.m_spans_u.
                           super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                           _M_impl.super__Vector_impl_data._M_start)->m_t0);
          points_1.
          super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar1;
          points_1.
          super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar1[1];
          loop.m_entry.
          super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               clipper.m_spans_v.
               super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11].m_t0;
          loop.m_entry.
          super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               clipper.m_spans_v.
               super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11].m_t1;
          IntegrationPoints::get
                    (&points,local_f0._24_8_,local_f0._16_8_,(Interval *)&points_1,(Interval *)&loop
                    );
          ptVar10 = points.
                    super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (ptVar13 = points.
                         super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; ptVar13 != ptVar10;
              ptVar13 = ptVar13 + 1) {
            points_1.
            super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)(ptVar13->super__Tuple_impl<0UL,_double,_double,_double>).
                          super__Head_base<0UL,_double,_false>._M_head_impl;
            points_1.
            super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)(ptVar13->super__Tuple_impl<0UL,_double,_double,_double>).
                          super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
                          super__Head_base<2UL,_double,_false>._M_head_impl;
            points_1.
            super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)(ptVar13->super__Tuple_impl<0UL,_double,_double,_double>).
                          super__Tuple_impl<1UL,_double,_double>.
                          super__Head_base<1UL,_double,_false>._M_head_impl;
            (**(code **)((long)(ptVar9->super__Tuple_impl<0UL,_double,_double,_double>).
                               super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>
                               .super__Head_base<2UL,_double,_false>._M_head_impl + 0x38))
                      ((int)points_1.
                            super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       points_1.
                       super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&loop,ptVar9,1);
            dVar2 = *(double *)
                     &((loop.m_entry.
                        super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->m_key).field_2;
            p_Var3 = ((loop.m_entry.
                       super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_data).
                     super___shared_ptr<anurbs::BrepLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            dVar4 = *(double *)
                     ((long)&((loop.m_entry.
                               super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->m_key).field_2 + 8);
            peVar5 = ((loop.m_entry.
                       super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_data).
                     super___shared_ptr<anurbs::BrepLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            peVar6 = ((loop.m_entry.
                       super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_attributes).
                     super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var7 = ((loop.m_entry.
                       super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_attributes).
                     super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            dVar17 = (double)p_Var7 * dVar4 - (double)peVar5 * (double)peVar6;
            dVar18 = (double)p_Var3 * (double)peVar5 - dVar2 * (double)p_Var7;
            dVar2 = dVar2 * (double)peVar6 - (double)p_Var3 * dVar4;
            trim.m_entry.
            super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 (SQRT(dVar2 * dVar2 + dVar18 * dVar18 + dVar17 * dVar17) *
                 (double)points_1.
                         super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
            std::
            vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>
            ::emplace_back<double_const&,double_const&,double>
                      (local_130,
                       (double *)
                       &points_1.
                        super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (double *)
                       &points_1.
                        super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,(double *)&trim);
            std::
            _Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
            ::~_Vector_base((_Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                             *)&loop);
          }
          std::
          _Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
          ::~_Vector_base(&points.
                           super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                         );
        }
        else {
          std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::vector
                    ((vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_> *)&points,
                     clipper.m_span_polygons.
                     super__Vector_base<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>,_std::allocator<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar12 + lVar11);
          local_120 = (Polygon *)
                      points.
                      super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          for (pPVar16 = (Polygon *)
                         points.
                         super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pPVar16 != local_120;
              pPVar16 = pPVar16 + 1) {
            PolygonIntegrationPoints::get(&points_1,(Index)local_128,pPVar16);
            ptVar10 = points_1.
                      super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ptVar13 = points_1.
                           super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; ptVar13 != ptVar10;
                ptVar13 = ptVar13 + 1) {
              local_138 = (pointer)(ptVar13->super__Tuple_impl<0UL,_double,_double,_double>).
                                   super__Head_base<0UL,_double,_false>._M_head_impl;
              loop.m_entry.
              super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)
                     (ptVar13->super__Tuple_impl<0UL,_double,_double,_double>).
                     super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
                     super__Head_base<2UL,_double,_false>._M_head_impl;
              loop.m_entry.
              super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (ptVar13->super__Tuple_impl<0UL,_double,_double,_double>).
                   super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>.
                   _M_head_impl;
              (**(code **)((long)(ptVar9->super__Tuple_impl<0UL,_double,_double,_double>).
                                 super__Tuple_impl<1UL,_double,_double>.
                                 super__Tuple_impl<2UL,_double>.super__Head_base<2UL,_double,_false>
                                 ._M_head_impl + 0x38))
                        ((int)local_138,
                         loop.m_entry.
                         super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi,
                         (_Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                          *)&trim,ptVar9,1);
              dVar2 = *(double *)
                       &((trim.m_entry.
                          super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->m_key).field_2;
              p_Var3 = ((trim.m_entry.
                         super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_data).
                       super___shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi;
              dVar4 = *(double *)
                       ((long)&((trim.m_entry.
                                 super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->m_key).field_2 + 8);
              peVar8 = ((trim.m_entry.
                         super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_data).
                       super___shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              peVar6 = ((trim.m_entry.
                         super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_attributes).
                       super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              p_Var7 = ((trim.m_entry.
                         super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_attributes).
                       super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
              dVar17 = (double)p_Var7 * dVar4 - (double)peVar8 * (double)peVar6;
              dVar18 = (double)p_Var3 * (double)peVar8 - dVar2 * (double)p_Var7;
              dVar2 = dVar2 * (double)peVar6 - (double)p_Var3 * dVar4;
              local_f0._0_8_ =
                   SQRT(dVar2 * dVar2 + dVar18 * dVar18 + dVar17 * dVar17) *
                   (double)loop.m_entry.
                           super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
              std::
              vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>
              ::emplace_back<double_const&,double_const&,double>
                        (local_130,(double *)&local_138,
                         (double *)
                         &loop.m_entry.
                          super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount,(double *)local_f0);
              std::
              _Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              ::~_Vector_base((_Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                               *)&trim);
            }
            std::
            _Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
            ::~_Vector_base(&points_1.
                             super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                           );
          }
          std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::~vector
                    ((vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_> *)&points);
        }
      }
    }
  }
  TrimmedSurfaceClipping::~TrimmedSurfaceClipping(&clipper);
  return (IntegrationPointList<2> *)local_130;
}

Assistant:

static IntegrationPointList<2> get(const BrepFace& face, const double tolerance)
    {
        TrimmedSurfaceClipping clipper(tolerance * 10, tolerance / 10);

        IntegrationPointList<2> integration_points;

        for (const auto loop : face.loops()) {
            clipper.begin_loop();

            for (const auto trim : loop->trims()) {
                clipper.add_curve(*trim->curve_2d());
            }

            clipper.end_loop();
        }

        const auto& surface_geometry = *face.surface_geometry().data();
        clipper.compute(surface_geometry.spans_u(), surface_geometry.spans_v());

        const auto degree_u = surface_geometry.degree_u();
        const auto degree_v = surface_geometry.degree_v();

        const auto degree = std::max(degree_u, degree_v) + 1;

        for (Index i = 0; i < clipper.nb_spans_u(); i++) {
            for (Index j = 0; j < clipper.nb_spans_v(); j++) {
                if (clipper.span_trim_type(i, j) == TrimTypes::Empty) {
                    continue;
                }

                if (clipper.span_trim_type(i, j) == TrimTypes::Full) {
                    const auto points = IntegrationPoints::get(degree_u + 1, degree_v + 1, clipper.span_u(i), clipper.span_v(j));

                    for (const auto [u, v, weight] : points) {
                        const auto ders = surface_geometry.derivatives_at(u, v, 1);

                        const auto n = cross(ders[1], ders[2]);

                        integration_points.emplace_back(u, v, weight * norm(n));
                    }
                } else {
                    const auto polygons = clipper.span_polygons(i, j);

                    for (const auto& polygon : polygons) {
                        const auto points = PolygonIntegrationPoints::get(degree, polygon);

                        for (const auto [u, v, weight] : points) {
                            const auto ders = surface_geometry.derivatives_at(u, v, 1);

                            const auto n = cross(ders[1], ders[2]);

                            integration_points.emplace_back(u, v, weight * norm(n));
                        }
                    }
                }
            }
        }

        return integration_points;
    }